

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_proxy.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  undefined8 *puVar4;
  char *__nptr;
  int iVar5;
  mbedtls_net_context mVar6;
  char *pcVar7;
  ulong uVar8;
  mbedtls_net_context mVar9;
  mbedtls_net_context listen_fd;
  mbedtls_net_context server_fd;
  mbedtls_net_context client_fd;
  fd_set read_fds;
  char error_buf [100];
  mbedtls_net_context local_124;
  mbedtls_net_context local_120;
  mbedtls_net_context local_11c;
  fd_set local_118;
  char local_98 [104];
  
  mbedtls_net_init(&local_124);
  mbedtls_net_init(&local_11c);
  mbedtls_net_init(&local_120);
  opt_0 = "localhost";
  opt_1 = "4433";
  opt_2 = "localhost";
  opt_3 = "5556";
  if (1 < argc) {
    uVar8 = 1;
    do {
      pcVar7 = argv[uVar8];
      pcVar3 = strchr(pcVar7,0x3d);
      if (pcVar3 == (char *)0x0) {
LAB_00102f16:
        printf(" unknown option or missing value: %s\n",pcVar7);
        printf(
              "\n usage: udp_proxy param=<>...\n\n acceptable parameters:\n    server_addr=%%s      default: localhost\n    server_port=%%d      default: 4433\n    listen_addr=%%s      default: localhost\n    listen_port=%%d      default: 4433\n\n    duplicate=%%d        default: 0 (no duplication)\n                        duplicate about 1:N packets randomly\n    delay=%%d            default: 0 (no delayed packets)\n                        delay about 1:N packets randomly\n    delay_ccs=0/1       default: 0 (don\'t delay ChangeCipherSpec)\n    drop=%%d             default: 0 (no dropped packets)\n                        drop about 1:N packets randomly\n    mtu=%%d              default: 0 (unlimited)\n                        drop packets larger than N bytes\n    bad_ad=0/1          default: 0 (don\'t add bad ApplicationData)\n    protect_hvr=0/1     default: 0 (don\'t protect HelloVerifyRequest)\n    protect_len=%%d     default: (don\'t protect packets of this size)\n\n    seed=%%d             default: (use current time)\n\n"
              );
        exit(1);
      }
      __nptr = pcVar3 + 1;
      *pcVar3 = '\0';
      iVar1 = strcmp(pcVar7,"server_addr");
      puVar4 = &opt_0;
      if (iVar1 == 0) {
LAB_00102a8d:
        *puVar4 = __nptr;
      }
      else {
        iVar1 = strcmp(pcVar7,"server_port");
        puVar4 = &opt_1;
        if (iVar1 == 0) goto LAB_00102a8d;
        iVar1 = strcmp(pcVar7,"listen_addr");
        puVar4 = &opt_2;
        if (iVar1 == 0) goto LAB_00102a8d;
        iVar1 = strcmp(pcVar7,"listen_port");
        puVar4 = &opt_3;
        if (iVar1 == 0) goto LAB_00102a8d;
        iVar1 = strcmp(pcVar7,"duplicate");
        if (iVar1 == 0) {
          opt_4 = atoi(__nptr);
          if (0x14 < opt_4) goto LAB_00102b45;
          goto LAB_00102a90;
        }
        iVar1 = strcmp(pcVar7,"delay");
        if (iVar1 == 0) {
          uVar2 = atoi(__nptr);
          opt_5 = uVar2;
LAB_00102aec:
          if ((0x14 < uVar2) || (uVar2 == 1)) goto LAB_00102b45;
        }
        else {
          iVar1 = strcmp(pcVar7,"delay_ccs");
          if (iVar1 == 0) {
            uVar2 = atoi(__nptr);
            opt_6 = uVar2;
            goto LAB_00102ad7;
          }
          iVar1 = strcmp(pcVar7,"drop");
          if (iVar1 == 0) {
            uVar2 = atoi(__nptr);
            opt_7 = uVar2;
            goto LAB_00102aec;
          }
          iVar1 = strcmp(pcVar7,"mtu");
          if (iVar1 == 0) {
            opt_8 = atoi(__nptr);
            if (0x4800 < opt_8) goto LAB_00102b45;
            goto LAB_00102a90;
          }
          iVar1 = strcmp(pcVar7,"bad_ad");
          if (iVar1 == 0) {
            uVar2 = atoi(__nptr);
            opt_9 = uVar2;
          }
          else {
            iVar1 = strcmp(pcVar7,"protect_hvr");
            if (iVar1 != 0) {
              iVar1 = strcmp(pcVar7,"protect_len");
              if (iVar1 == 0) {
                opt_11 = atoi(__nptr);
                if (opt_11 < 0) goto LAB_00102b45;
              }
              else {
                iVar1 = strcmp(pcVar7,"seed");
                if (iVar1 != 0) goto LAB_00102f16;
                opt_12 = atoi(__nptr);
                if (opt_12 == 0) goto LAB_00102b45;
              }
              goto LAB_00102a90;
            }
            uVar2 = atoi(__nptr);
            opt_10 = uVar2;
          }
LAB_00102ad7:
          if (1 < uVar2) {
LAB_00102b45:
            exit_usage(pcVar7,__nptr);
            break;
          }
        }
      }
LAB_00102a90:
      uVar8 = uVar8 + 1;
    } while ((uint)argc != uVar8);
  }
  if (opt_12 == 0) {
    uVar8 = time((time_t *)0x0);
    opt_12 = (uint)uVar8;
    printf("  . Pseudo-random seed: %u\n",uVar8 & 0xffffffff);
  }
  srand(opt_12);
  printf("  . Connect to server on UDP/%s/%s ...",opt_0,opt_1);
  fflush(_stdout);
  uVar2 = mbedtls_net_connect(&local_120,opt_0,opt_1,1);
  if (uVar2 == 0) {
    puts(" ok");
    printf("  . Bind on UDP/%s/%s ...",opt_2,opt_3);
    fflush(_stdout);
    uVar2 = mbedtls_net_bind(&local_124,opt_2,opt_3,1);
    if (uVar2 == 0) {
      puts(" ok");
      mbedtls_net_free(&local_11c);
      printf("  . Waiting for a remote connection ...");
      fflush(_stdout);
      uVar2 = mbedtls_net_accept(&local_124,&local_11c,(void *)0x0,0,(size_t *)0x0);
      if (uVar2 == 0) {
        do {
          puts(" ok");
          memset(&prev,0,0x4820);
          memset(dropped,0,0x800);
          uVar8 = (ulong)(uint)local_120.fd;
          mVar9.fd = local_120.fd;
          if (local_120.fd < local_11c.fd) {
            mVar9.fd = local_11c.fd;
          }
          if (mVar9.fd <= local_124.fd) {
            mVar9.fd = local_124.fd;
          }
          while( true ) {
            local_118.fds_bits[0xe] = 0;
            local_118.fds_bits[0xf] = 0;
            local_118.fds_bits[0xc] = 0;
            local_118.fds_bits[0xd] = 0;
            local_118.fds_bits[10] = 0;
            local_118.fds_bits[0xb] = 0;
            local_118.fds_bits[8] = 0;
            local_118.fds_bits[9] = 0;
            local_118.fds_bits[6] = 0;
            local_118.fds_bits[7] = 0;
            local_118.fds_bits[4] = 0;
            local_118.fds_bits[5] = 0;
            local_118.fds_bits[2] = 0;
            local_118.fds_bits[3] = 0;
            local_118.fds_bits[0] = 0;
            local_118.fds_bits[1] = 0;
            iVar1 = (int)uVar8;
            iVar5 = iVar1 + 0x3f;
            if (-1 < iVar1) {
              iVar5 = iVar1;
            }
            local_118.fds_bits[iVar5 >> 6] =
                 local_118.fds_bits[iVar5 >> 6] | 1L << ((byte)uVar8 & 0x3f);
            mVar6.fd = local_11c.fd + 0x3f;
            if (-1 < local_11c.fd) {
              mVar6.fd = local_11c.fd;
            }
            local_118.fds_bits[mVar6.fd >> 6] =
                 local_118.fds_bits[mVar6.fd >> 6] | 1L << ((byte)local_11c.fd & 0x3f);
            mVar6.fd = local_124.fd + 0x3f;
            if (-1 < local_124.fd) {
              mVar6.fd = local_124.fd;
            }
            local_118.fds_bits[mVar6.fd >> 6] =
                 local_118.fds_bits[mVar6.fd >> 6] | 1L << ((byte)(local_124.fd % 0x40) & 0x3f);
            uVar2 = select(mVar9.fd + 1,&local_118,(fd_set *)0x0,(fd_set *)0x0,(timeval *)0x0);
            if ((int)uVar2 < 1) {
              perror("select");
              if (uVar2 != 0) goto LAB_00102e85;
              iVar1 = 0;
              goto LAB_00102ec1;
            }
            mVar6.fd = local_124.fd + 0x3f;
            if (-1 < local_124.fd) {
              mVar6.fd = local_124.fd;
            }
            if (((ulong)local_118.fds_bits[mVar6.fd >> 6] >> ((ulong)(uint)local_124.fd & 0x3f) & 1)
                != 0) break;
            mVar6.fd = local_11c.fd + 0x3f;
            if (-1 < local_11c.fd) {
              mVar6.fd = local_11c.fd;
            }
            if ((((ulong)local_118.fds_bits[mVar6.fd >> 6] >> ((ulong)(uint)local_11c.fd & 0x3f) & 1
                 ) != 0) && (iVar1 = handle_message("S <- C",&local_120,&local_11c), iVar1 != 0))
            break;
            uVar8 = (ulong)(uint)local_120.fd;
            mVar6.fd = local_120.fd + 0x3f;
            if (-1 < local_120.fd) {
              mVar6.fd = local_120.fd;
            }
            if (((ulong)local_118.fds_bits[mVar6.fd >> 6] >> (uVar8 & 0x3f) & 1) != 0) {
              iVar1 = handle_message("S -> C",&local_11c,&local_120);
              if (iVar1 != 0) break;
              uVar8 = (ulong)(uint)local_120.fd;
            }
          }
          mbedtls_net_free(&local_11c);
          printf("  . Waiting for a remote connection ...");
          fflush(_stdout);
          uVar2 = mbedtls_net_accept(&local_124,&local_11c,(void *)0x0,0,(size_t *)0x0);
        } while (uVar2 == 0);
      }
      pcVar7 = " failed\n  ! mbedtls_net_accept returned %d\n\n";
    }
    else {
      pcVar7 = " failed\n  ! mbedtls_net_bind returned %d\n\n";
    }
  }
  else {
    pcVar7 = " failed\n  ! mbedtls_net_connect returned %d\n\n";
  }
  printf(pcVar7,(ulong)uVar2);
LAB_00102e85:
  mbedtls_strerror(uVar2,local_98,100);
  printf("Last error was: -0x%04X - %s\n\n",(ulong)-uVar2,local_98);
  fflush(_stdout);
  iVar1 = 1;
LAB_00102ec1:
  mbedtls_net_free(&local_11c);
  mbedtls_net_free(&local_120);
  mbedtls_net_free(&local_124);
  return iVar1;
}

Assistant:

int main( int argc, char *argv[] )
{
    int ret;

    mbedtls_net_context listen_fd, client_fd, server_fd;

    int nb_fds;
    fd_set read_fds;

    mbedtls_net_init( &listen_fd );
    mbedtls_net_init( &client_fd );
    mbedtls_net_init( &server_fd );

    get_options( argc, argv );

    /*
     * Decisions to drop/delay/duplicate packets are pseudo-random: dropping
     * exactly 1 in N packets would lead to problems when a flight has exactly
     * N packets: the same packet would be dropped on every resend.
     *
     * In order to be able to reproduce problems reliably, the seed may be
     * specified explicitly.
     */
    if( opt.seed == 0 )
    {
        opt.seed = (unsigned int) time( NULL );
        mbedtls_printf( "  . Pseudo-random seed: %u\n", opt.seed );
    }

    srand( opt.seed );

    /*
     * 0. "Connect" to the server
     */
    mbedtls_printf( "  . Connect to server on UDP/%s/%s ...",
            opt.server_addr, opt.server_port );
    fflush( stdout );

    if( ( ret = mbedtls_net_connect( &server_fd, opt.server_addr, opt.server_port,
                             MBEDTLS_NET_PROTO_UDP ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_net_connect returned %d\n\n", ret );
        goto exit;
    }

    mbedtls_printf( " ok\n" );

    /*
     * 1. Setup the "listening" UDP socket
     */
    mbedtls_printf( "  . Bind on UDP/%s/%s ...",
            opt.listen_addr, opt.listen_port );
    fflush( stdout );

    if( ( ret = mbedtls_net_bind( &listen_fd, opt.listen_addr, opt.listen_port,
                          MBEDTLS_NET_PROTO_UDP ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_net_bind returned %d\n\n", ret );
        goto exit;
    }

    mbedtls_printf( " ok\n" );

    /*
     * 2. Wait until a client connects
     */
accept:
    mbedtls_net_free( &client_fd );

    mbedtls_printf( "  . Waiting for a remote connection ..." );
    fflush( stdout );

    if( ( ret = mbedtls_net_accept( &listen_fd, &client_fd,
                                    NULL, 0, NULL ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_net_accept returned %d\n\n", ret );
        goto exit;
    }

    mbedtls_printf( " ok\n" );

    /*
     * 3. Forward packets forever (kill the process to terminate it)
     */
    clear_pending();
    memset( dropped, 0, sizeof( dropped ) );

    nb_fds = client_fd.fd;
    if( nb_fds < server_fd.fd )
        nb_fds = server_fd.fd;
    if( nb_fds < listen_fd.fd )
        nb_fds = listen_fd.fd;
    ++nb_fds;

    while( 1 )
    {
        FD_ZERO( &read_fds );
        FD_SET( server_fd.fd, &read_fds );
        FD_SET( client_fd.fd, &read_fds );
        FD_SET( listen_fd.fd, &read_fds );

        if( ( ret = select( nb_fds, &read_fds, NULL, NULL, NULL ) ) <= 0 )
        {
            perror( "select" );
            goto exit;
        }

        if( FD_ISSET( listen_fd.fd, &read_fds ) )
            goto accept;

        if( FD_ISSET( client_fd.fd, &read_fds ) )
        {
            if( ( ret = handle_message( "S <- C",
                                        &server_fd, &client_fd ) ) != 0 )
                goto accept;
        }

        if( FD_ISSET( server_fd.fd, &read_fds ) )
        {
            if( ( ret = handle_message( "S -> C",
                                        &client_fd, &server_fd ) ) != 0 )
                goto accept;
        }
    }

exit:

#ifdef MBEDTLS_ERROR_C
    if( ret != 0 )
    {
        char error_buf[100];
        mbedtls_strerror( ret, error_buf, 100 );
        mbedtls_printf( "Last error was: -0x%04X - %s\n\n", - ret, error_buf );
        fflush( stdout );
    }
#endif

    mbedtls_net_free( &client_fd );
    mbedtls_net_free( &server_fd );
    mbedtls_net_free( &listen_fd );

#if defined(_WIN32)
    mbedtls_printf( "  Press Enter to exit this program.\n" );
    fflush( stdout ); getchar();
#endif

    return( ret != 0 );
}